

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS
ref_grid_extrude_twod(REF_GRID_conflict *extruded_grid,REF_GRID twod_grid,REF_INT n_planes)

{
  REF_NODE pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  REF_GRID_conflict pRVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  REF_STATUS RVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  undefined8 uVar13;
  long lVar14;
  REF_CELL pRVar15;
  char *pcVar16;
  REF_GLOB n_global;
  REF_GRID pRVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  REF_INT RVar21;
  REF_INT max_faceid;
  REF_INT new_cell;
  REF_INT faceid1;
  REF_INT new_node;
  REF_INT nodes [27];
  int local_16c;
  REF_INT local_168;
  int local_164;
  REF_GRID local_160;
  REF_DBL local_158;
  ulong local_150;
  REF_GRID_conflict local_148;
  int local_13c;
  undefined8 local_138;
  int iStack_130;
  int iStack_12c;
  undefined8 local_128;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  double local_b0;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  
  pRVar1 = twod_grid->node;
  *extruded_grid = (REF_GRID_conflict)0x0;
  if (twod_grid->twod == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x3f9,
           "ref_grid_extrude_twod","require twod grid input");
    RVar8 = 1;
  }
  else {
    uVar6 = ref_grid_create(extruded_grid,twod_grid->mpi);
    if (uVar6 == 0) {
      local_148 = *extruded_grid;
      ref_node = local_148->node;
      uVar12 = 0;
      local_160 = twod_grid;
      local_150 = (ulong)(uint)n_planes;
      if (n_planes < 1) {
        n_global = 0;
      }
      else {
        local_b0 = (double)(n_planes + -1);
        iVar7 = pRVar1->max;
        n_global = 0;
        do {
          local_138 = uVar12;
          if (0 < iVar7) {
            local_158 = (double)(int)uVar12 / local_b0;
            lVar18 = 1;
            lVar20 = 0;
            do {
              if (-1 < pRVar1->global[lVar20]) {
                uVar6 = ref_node_add(ref_node,pRVar1->global[lVar20] + n_global,&local_13c);
                if (uVar6 != 0) {
                  uVar12 = (ulong)uVar6;
                  pcVar16 = "add node in plane";
                  uVar13 = 0x405;
                  goto LAB_00157ee7;
                }
                ref_node->part[local_13c] = pRVar1->part[lVar20];
                pRVar2 = pRVar1->real;
                pRVar3 = ref_node->real;
                lVar14 = (long)local_13c;
                pRVar3[lVar14 * 0xf] = pRVar2[lVar18 + -1];
                pRVar3[lVar14 * 0xf + 1] = local_158;
                pRVar3[lVar14 * 0xf + 2] = pRVar2[lVar18];
                iVar7 = pRVar1->max;
              }
              lVar20 = lVar20 + 1;
              lVar18 = lVar18 + 0xf;
            } while (lVar20 < iVar7);
          }
          n_global = n_global + pRVar1->old_n_global;
          uVar6 = (int)local_138 + 1;
          uVar12 = (ulong)uVar6;
        } while (uVar6 != (uint)local_150);
      }
      iVar7 = (int)local_150;
      uVar6 = ref_node_initialize_n_global(ref_node,n_global);
      if (uVar6 == 0) {
        pRVar15 = local_160->cell[0];
        if (pRVar15->max < 1) {
          local_16c = -0x80000000;
          pRVar17 = local_160;
        }
        else {
          iVar7 = iVar7 + -1;
          RVar21 = 0;
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          local_158 = (REF_DBL)CONCAT44(local_158._4_4_,iVar7);
          do {
            RVar8 = ref_cell_nodes(pRVar15,RVar21,&local_a8);
            if (RVar8 == 0) {
              uVar6 = ref_grid_orient_edg(local_160,&local_a8);
              iVar5 = iStack_a4;
              iVar7 = local_a8;
              if (uVar6 != 0) {
                uVar12 = (ulong)uVar6;
                pcVar16 = "orient_edge";
                uVar13 = 0x412;
                goto LAB_00157ee7;
              }
              iVar19 = 0;
              while (local_158._0_4_ != iVar19) {
                iVar11 = pRVar1->n * iVar19;
                iVar19 = iVar19 + 1;
                iStack_11c = pRVar1->n * iVar19;
                local_128 = CONCAT44(iVar11 + iVar7,iVar11 + iVar5);
                iStack_120 = iStack_11c + iVar7;
                iStack_11c = iStack_11c + iVar5;
                local_118 = iStack_a0;
                uVar6 = ref_cell_add(local_148->cell[6],(REF_INT *)&local_128,&local_168);
                if (uVar6 != 0) {
                  uVar12 = (ulong)uVar6;
                  pcVar16 = "boundary";
                  uVar13 = 0x41e;
                  goto LAB_00157ee7;
                }
              }
            }
            pRVar17 = local_160;
            RVar21 = RVar21 + 1;
            pRVar15 = local_160->cell[0];
          } while (RVar21 < pRVar15->max);
          local_16c = -0x80000000;
          iVar7 = (int)local_150;
          if (0 < pRVar15->max) {
            RVar21 = 0;
            do {
              RVar8 = ref_cell_nodes(pRVar15,RVar21,&local_a8);
              iVar5 = local_16c;
              if ((RVar8 == 0) && (iVar5 = iStack_a0, iStack_a0 < local_16c)) {
                iVar5 = local_16c;
              }
              local_16c = iVar5;
              RVar21 = RVar21 + 1;
              pRVar15 = pRVar17->cell[0];
            } while (RVar21 < pRVar15->max);
          }
        }
        local_164 = local_16c;
        uVar6 = ref_mpi_max(pRVar17->mpi,&local_164,&local_16c,1);
        if (uVar6 == 0) {
          uVar6 = ref_mpi_bcast(pRVar17->mpi,&local_16c,1,1);
          if (uVar6 == 0) {
            local_164 = local_16c + 1;
            local_158 = (REF_DBL)(ulong)(local_16c + 2);
            uVar6 = iVar7 - 1;
            local_138 = CONCAT44(local_138._4_4_,pRVar1->n * uVar6);
            pRVar15 = pRVar17->cell[3];
            if (0 < pRVar15->max) {
              RVar21 = 0;
              uVar9 = 0;
              if (0 < (int)uVar6) {
                uVar9 = uVar6;
              }
              local_150 = (ulong)uVar6;
              do {
                RVar8 = ref_cell_nodes(pRVar15,RVar21,&local_a8);
                pRVar4 = local_148;
                if (RVar8 == 0) {
                  local_128 = CONCAT44(iStack_a4,local_a8);
                  iStack_120 = iStack_a0;
                  iStack_11c = local_164;
                  uVar6 = ref_cell_add(local_148->cell[3],(REF_INT *)&local_128,&local_168);
                  if (uVar6 != 0) {
                    uVar12 = (ulong)uVar6;
                    pcVar16 = "boundary";
                    uVar13 = 0x435;
                    goto LAB_00157ee7;
                  }
                  local_128 = CONCAT44(iStack_a0 + (int)local_138,local_a8 + (int)local_138);
                  iStack_120 = iStack_a4 + (int)local_138;
                  iStack_11c = SUB84(local_158,0);
                  uVar6 = ref_cell_add(pRVar4->cell[3],(REF_INT *)&local_128,&local_168);
                  if (uVar6 != 0) {
                    uVar12 = (ulong)uVar6;
                    pcVar16 = "boundary";
                    uVar13 = 0x43a;
                    goto LAB_00157ee7;
                  }
                  uVar6 = 0;
                  while (uVar9 != uVar6) {
                    iStack_120 = pRVar1->n * uVar6;
                    uVar6 = uVar6 + 1;
                    local_114 = pRVar1->n * uVar6;
                    local_128 = CONCAT44(iStack_a4 + iStack_120,local_a8 + iStack_120);
                    iStack_120 = iStack_120 + iStack_a0;
                    iStack_11c = local_a8 + local_114;
                    local_118 = iStack_a4 + local_114;
                    local_114 = local_114 + iStack_a0;
                    uVar10 = ref_cell_add(local_148->cell[10],(REF_INT *)&local_128,&local_168);
                    if (uVar10 != 0) {
                      uVar12 = (ulong)uVar10;
                      pcVar16 = "interior";
                      uVar13 = 0x445;
                      goto LAB_00157ee7;
                    }
                  }
                }
                RVar21 = RVar21 + 1;
                pRVar15 = local_160->cell[3];
              } while (RVar21 < pRVar15->max);
              uVar6 = (uint)local_150;
              local_138 = (ulong)(pRVar1->n * uVar6);
              pRVar17 = local_160;
            }
            pRVar15 = pRVar17->cell[6];
            if (pRVar15->max < 1) {
              return 0;
            }
            RVar21 = 0;
            if ((int)uVar6 < 1) {
              uVar6 = 0;
            }
            local_138 = CONCAT44((int)local_138,(int)local_138);
            iStack_130 = (int)local_138;
            iStack_12c = (int)local_138;
            do {
              RVar8 = ref_cell_nodes(pRVar15,RVar21,&local_a8);
              pRVar4 = local_148;
              if (RVar8 == 0) {
                local_128 = CONCAT44(iStack_a0,iStack_a4);
                iStack_120 = iStack_a4;
                iStack_11c = local_a8;
                local_118 = local_164;
                uVar9 = ref_cell_add(local_148->cell[6],(REF_INT *)&local_128,&local_168);
                if (uVar9 != 0) {
                  uVar12 = (ulong)uVar9;
                  pcVar16 = "boundary";
                  uVar13 = 0x450;
                  goto LAB_00157ee7;
                }
                iStack_120 = iStack_a0 + iStack_130;
                iStack_11c = iStack_9c + iStack_12c;
                local_128 = CONCAT44(iStack_a4 + local_138._4_4_,local_a8 + (int)local_138);
                local_118 = SUB84(local_158,0);
                uVar9 = ref_cell_add(pRVar4->cell[6],(REF_INT *)&local_128,&local_168);
                if (uVar9 != 0) {
                  uVar12 = (ulong)uVar9;
                  pcVar16 = "boundary";
                  uVar13 = 0x456;
                  goto LAB_00157ee7;
                }
                uVar9 = 0;
                while (uVar6 != uVar9) {
                  iStack_11c = pRVar1->n * uVar9;
                  uVar9 = uVar9 + 1;
                  local_10c = pRVar1->n * uVar9;
                  local_128 = CONCAT44(iStack_a4 + iStack_11c,local_a8 + iStack_11c);
                  iStack_120 = iStack_a0 + iStack_11c;
                  iStack_11c = iStack_11c + iStack_9c;
                  local_118 = local_a8 + local_10c;
                  local_114 = iStack_a4 + local_10c;
                  local_110 = iStack_a0 + local_10c;
                  local_10c = local_10c + iStack_9c;
                  uVar10 = ref_cell_add(local_148->cell[0xb],(REF_INT *)&local_128,&local_168);
                  if (uVar10 != 0) {
                    uVar12 = (ulong)uVar10;
                    pcVar16 = "boundary";
                    uVar13 = 0x463;
                    goto LAB_00157ee7;
                  }
                }
              }
              RVar21 = RVar21 + 1;
              pRVar15 = local_160->cell[6];
              if (pRVar15->max <= RVar21) {
                return 0;
              }
            } while( true );
          }
          uVar12 = (ulong)uVar6;
          pcVar16 = "share max faceid";
          uVar13 = 0x42b;
        }
        else {
          uVar12 = (ulong)uVar6;
          pcVar16 = "max faceid";
          uVar13 = 0x429;
        }
      }
      else {
        uVar12 = (ulong)uVar6;
        pcVar16 = "init glob";
        uVar13 = 0x40d;
      }
    }
    else {
      uVar12 = (ulong)uVar6;
      pcVar16 = "create grid";
      uVar13 = 0x3fa;
    }
LAB_00157ee7:
    RVar8 = (REF_STATUS)uVar12;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar13,
           "ref_grid_extrude_twod",uVar12,pcVar16);
  }
  return RVar8;
}

Assistant:

REF_FCN REF_STATUS ref_grid_extrude_twod(REF_GRID *extruded_grid,
                                         REF_GRID twod_grid, REF_INT n_planes) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_NODE twod_node = ref_grid_node(twod_grid);
  REF_INT plane, node, new_node;
  REF_INT offset, offset0, offset1;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, new_cell;
  REF_INT max_faceid, faceid1, faceid2;
  REF_GLOB global_offset;
  REF_DBL y;
  *extruded_grid = NULL;
  RAS(ref_grid_twod(twod_grid), "require twod grid input");
  RSS(ref_grid_create(extruded_grid, ref_grid_mpi(twod_grid)), "create grid");
  ref_grid = *extruded_grid;
  ref_node = ref_grid_node(ref_grid);

  global_offset = 0;
  for (plane = 0; plane < n_planes; plane++) {
    y = (REF_DBL)plane / (REF_DBL)(n_planes - 1);
    each_ref_node_valid_node(twod_node, node) {
      RSS(ref_node_add(ref_node,
                       ref_node_global(twod_node, node) + global_offset,
                       &new_node),
          "add node in plane");
      ref_node_part(ref_node, new_node) = ref_node_part(twod_node, node);
      ref_node_xyz(ref_node, 0, new_node) = ref_node_xyz(twod_node, 0, node);
      ref_node_xyz(ref_node, 1, new_node) = y;
      ref_node_xyz(ref_node, 2, new_node) = ref_node_xyz(twod_node, 1, node);
    }
    global_offset += ref_node_n_global(twod_node);
  }
  RSS(ref_node_initialize_n_global(ref_node, global_offset), "init glob");

  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(twod_grid), cell, nodes) {
    REF_INT node0, node1;
    /* use triangle to orient edge correctly */
    RSS(ref_grid_orient_edg(twod_grid, nodes), "orient_edge");
    node0 = nodes[0];
    node1 = nodes[1];
    for (plane = 0; plane < n_planes - 1; plane++) {
      offset0 = (0 + plane) * ref_node_n(twod_node);
      offset1 = (1 + plane) * ref_node_n(twod_node);
      new_nodes[0] = node1 + offset0;
      new_nodes[1] = node0 + offset0;
      new_nodes[2] = node0 + offset1;
      new_nodes[3] = node1 + offset1;
      new_nodes[4] = nodes[2];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), new_nodes, &new_cell),
          "boundary");
    }
  }

  /* find two unused faceids for the symmetry planes */
  max_faceid = REF_INT_MIN;
  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(twod_grid), cell, nodes) {
    max_faceid = MAX(max_faceid, nodes[2]);
  }
  faceid1 = max_faceid;
  RSS(ref_mpi_max(ref_grid_mpi(twod_grid), &faceid1, &max_faceid, REF_INT_TYPE),
      "max faceid");
  RSS(ref_mpi_bcast(ref_grid_mpi(twod_grid), &max_faceid, 1, REF_INT_TYPE),
      "share max faceid");
  faceid1 = max_faceid + 1;
  faceid2 = max_faceid + 2;

  offset = (n_planes - 1) * ref_node_n(twod_node);
  each_ref_cell_valid_cell_with_nodes(ref_grid_tri(twod_grid), cell, nodes) {
    new_nodes[0] = nodes[0];
    new_nodes[1] = nodes[1];
    new_nodes[2] = nodes[2];
    new_nodes[3] = faceid1;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), new_nodes, &new_cell), "boundary");
    new_nodes[0] = nodes[0] + offset;
    new_nodes[1] = nodes[2] + offset;
    new_nodes[2] = nodes[1] + offset;
    new_nodes[3] = faceid2;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), new_nodes, &new_cell), "boundary");
    for (plane = 0; plane < n_planes - 1; plane++) {
      offset0 = (0 + plane) * ref_node_n(twod_node);
      offset1 = (1 + plane) * ref_node_n(twod_node);
      new_nodes[0] = nodes[0] + offset0;
      new_nodes[1] = nodes[1] + offset0;
      new_nodes[2] = nodes[2] + offset0;
      new_nodes[3] = nodes[0] + offset1;
      new_nodes[4] = nodes[1] + offset1;
      new_nodes[5] = nodes[2] + offset1;
      RSS(ref_cell_add(ref_grid_pri(ref_grid), new_nodes, &new_cell),
          "interior");
    }
  }

  offset = (n_planes - 1) * ref_node_n(twod_node);
  each_ref_cell_valid_cell_with_nodes(ref_grid_qua(twod_grid), cell, nodes) {
    new_nodes[0] = nodes[3];
    new_nodes[1] = nodes[2];
    new_nodes[2] = nodes[1];
    new_nodes[3] = nodes[0];
    new_nodes[4] = faceid1;
    RSS(ref_cell_add(ref_grid_qua(ref_grid), new_nodes, &new_cell), "boundary");
    new_nodes[0] = nodes[0] + offset;
    new_nodes[1] = nodes[1] + offset;
    new_nodes[2] = nodes[2] + offset;
    new_nodes[3] = nodes[3] + offset;
    new_nodes[4] = faceid2;
    RSS(ref_cell_add(ref_grid_qua(ref_grid), new_nodes, &new_cell), "boundary");
    for (plane = 0; plane < n_planes - 1; plane++) {
      offset0 = (0 + plane) * ref_node_n(twod_node);
      offset1 = (1 + plane) * ref_node_n(twod_node);
      new_nodes[0] = nodes[0] + offset0;
      new_nodes[1] = nodes[1] + offset0;
      new_nodes[2] = nodes[2] + offset0;
      new_nodes[3] = nodes[3] + offset0;
      new_nodes[4] = nodes[0] + offset1;
      new_nodes[5] = nodes[1] + offset1;
      new_nodes[6] = nodes[2] + offset1;
      new_nodes[7] = nodes[3] + offset1;
      RSS(ref_cell_add(ref_grid_hex(ref_grid), new_nodes, &new_cell),
          "boundary");
    }
  }

  return REF_SUCCESS;
}